

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O2

bool __thiscall kws::Parser::IsInAnyComments(Parser *this,size_t pos)

{
  ulong uVar1;
  ulong uVar2;
  string *psVar3;
  bool bVar4;
  
  psVar3 = &this->m_Buffer;
  uVar1 = std::__cxx11::string::find((char *)psVar3,0x1554fa);
  while( true ) {
    uVar2 = 0xffffffffffffffff;
    if (uVar1 != 0xffffffffffffffff) {
      uVar2 = std::__cxx11::string::find((char *)psVar3,0x1554d2);
    }
    if (uVar2 == 0xffffffffffffffff) break;
    if (uVar1 <= pos && pos <= uVar2) {
      return true;
    }
    uVar1 = std::__cxx11::string::find((char *)psVar3,0x1554fa);
  }
  uVar1 = std::__cxx11::string::find((char *)psVar3,0x1554fd);
  while( true ) {
    uVar2 = 0xffffffffffffffff;
    if (uVar1 != 0xffffffffffffffff) {
      uVar2 = std::__cxx11::string::find((char *)psVar3,0x155500);
    }
    bVar4 = uVar2 != 0xffffffffffffffff;
    if (!bVar4) break;
    if (pos <= uVar2 && uVar1 <= pos) {
      return bVar4;
    }
    uVar1 = std::__cxx11::string::find((char *)psVar3,0x1554fd);
  }
  return bVar4;
}

Assistant:

bool Parser::IsInAnyComments(size_t pos) const
{
  //Check //
  size_t posslash = m_Buffer.find("//",0);
  size_t posend = std::string::npos;
  if(posslash != std::string::npos)
    {
    posend = m_Buffer.find("\n",posslash);
    }

  while(posend != std::string::npos)
    {
    if(pos<=posend && pos>=posslash)
      {
      return true;
      }
    posslash = m_Buffer.find("//",posend+1);
    if(posslash != std::string::npos)
      {
      posend = m_Buffer.find("\n",posslash);
      }
    else
      {
      posend = std::string::npos;
      }
    }

  // Check the /* */
  size_t posstart = m_Buffer.find("/*",0);
  posend = std::string::npos;
  if(posstart != std::string::npos)
    {
    posend = m_Buffer.find("*/",posstart);
    }

  while(posend != std::string::npos)
    {
    if(pos<=posend && pos>=posstart)
      {
      return true;
      }
    posstart = m_Buffer.find("/*",posend+1);
    if(posstart != std::string::npos)
      {
      posend = m_Buffer.find("*/",posstart);
      }
    else
      {
      posend = std::string::npos;
      }
    }
  return false;
}